

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall SpriteBase::make_alpha_mask(SpriteBase *this)

{
  uchar *puVar1;
  uint local_24;
  uint local_20;
  uint i_1;
  uint i;
  uint8_t min;
  Color *c;
  SpriteBase *this_local;
  
  _i = this->data;
  i_1._3_1_ = 0xff;
  c = (Color *)this;
  for (local_20 = 0; (ulong)local_20 < this->width * this->height; local_20 = local_20 + 1) {
    if (_i[3] != 0) {
      _i[3] = -(char)(int)((double)*_i * 0.07 + (double)_i[2] * 0.21 + (double)_i[1] * 0.72) - 1;
      _i[2] = 0;
      _i[1] = 0;
      *_i = 0;
      puVar1 = std::min<unsigned_char>((uchar *)((long)&i_1 + 3),_i + 3);
      i_1._3_1_ = *puVar1;
    }
    _i = _i + 4;
  }
  _i = this->data;
  for (local_24 = 0; (ulong)local_24 < this->width * this->height; local_24 = local_24 + 1) {
    if (_i[3] != '\0') {
      _i[3] = _i[3] - i_1._3_1_;
    }
    _i = _i + 4;
  }
  return;
}

Assistant:

void
SpriteBase::make_alpha_mask() {
  Color *c = reinterpret_cast<Color*>(data);
  uint8_t min = 0xFF;
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = 0xff - static_cast<uint8_t>((0.21 * c->red) +
                                             (0.72 * c->green) +
                                             (0.07 * c->blue));
      c->red = 0;
      c->green = 0;
      c->blue = 0;
      min = std::min(min, c->alpha);
    }
    c++;
  }

  c = reinterpret_cast<Color*>(data);
  for (unsigned int i = 0; i < width * height; i++) {
    if (c->alpha != 0x00) {
      c->alpha = c->alpha - min;
    }
    c++;
  }
}